

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplay.h
# Opt level: O2

HighsInt highs_splay<int,presolve::HPresolve::unlink(int)::__0&,presolve::HPresolve::unlink(int)::__1&,presolve::HPresolve::unlink(int)::__2&>
                   (int *key,HighsInt root,anon_class_8_1_8991fb9c *get_left,
                   anon_class_8_1_8991fb9c *get_right,anon_class_8_1_8991fb9c *get_key)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  HPresolve *pHVar4;
  HPresolve *pHVar5;
  pointer piVar6;
  pointer piVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  HighsInt y;
  long lVar12;
  int local_28;
  int local_24;
  HighsInt Nright;
  HighsInt Nleft;
  
  if (root == -1) {
    return -1;
  }
  piVar10 = &local_24;
  local_24 = -1;
  piVar11 = &local_28;
  local_28 = -1;
  piVar3 = (get_key->this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar4 = get_right->this;
  pHVar5 = get_left->this;
  do {
    iVar1 = *key;
    lVar8 = (long)root;
    if (iVar1 < piVar3[lVar8]) {
      piVar6 = (pHVar5->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar6[lVar8];
      lVar12 = (long)iVar2;
      if (lVar12 == -1) goto LAB_00312421;
      if (iVar1 < piVar3[lVar12]) {
        piVar7 = (pHVar4->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6[lVar8] = piVar7[lVar12];
        piVar7[lVar12] = root;
        lVar8 = lVar12;
        root = iVar2;
        if (piVar6[lVar12] == -1) goto LAB_00312421;
      }
      *piVar10 = root;
      piVar9 = piVar6 + lVar8;
      piVar10 = piVar9;
    }
    else {
      if (iVar1 <= piVar3[lVar8]) {
LAB_00312421:
        piVar3 = (get_left->this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *piVar11 = piVar3[lVar8];
        piVar6 = (get_right->this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *piVar10 = piVar6[lVar8];
        piVar3[lVar8] = local_28;
        piVar6[lVar8] = local_24;
        return root;
      }
      piVar6 = (pHVar4->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = piVar6[lVar8];
      lVar12 = (long)iVar2;
      if (lVar12 == -1) goto LAB_00312421;
      if (piVar3[lVar12] < iVar1) {
        piVar7 = (pHVar5->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6[lVar8] = piVar7[lVar12];
        piVar7[lVar12] = root;
        lVar8 = lVar12;
        root = iVar2;
        if (piVar6[lVar12] == -1) goto LAB_00312421;
      }
      *piVar11 = root;
      piVar9 = piVar6 + lVar8;
      piVar11 = piVar9;
    }
    root = *piVar9;
  } while( true );
}

Assistant:

HighsInt highs_splay(const KeyT& key, HighsInt root, GetLeft&& get_left,
                     GetRight&& get_right, GetKey&& get_key) {
  if (root == -1) return -1;

  HighsInt Nleft = -1;
  HighsInt Nright = -1;
  HighsInt* lright = &Nright;
  HighsInt* rleft = &Nleft;

  while (true) {
    if (key < get_key(root)) {
      HighsInt left = get_left(root);
      if (left == -1) break;
      if (key < get_key(left)) {
        HighsInt y = left;
        get_left(root) = get_right(y);
        get_right(y) = root;
        root = y;
        if (get_left(root) == -1) break;
      }

      *rleft = root;
      rleft = &get_left(root);
      root = get_left(root);
    } else if (key > get_key(root)) {
      HighsInt right = get_right(root);
      if (right == -1) break;
      if (key > get_key(right)) {
        HighsInt y = right;
        get_right(root) = get_left(y);
        get_left(y) = root;
        root = y;
        if (get_right(root) == -1) break;
      }

      *lright = root;
      lright = &get_right(root);
      root = get_right(root);
    } else
      break;
  }

  *lright = get_left(root);
  *rleft = get_right(root);
  get_left(root) = Nright;
  get_right(root) = Nleft;

  return root;
}